

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_generator_generate_internal
              (secp256k1_context *ctx,secp256k1_generator *gen,uchar *key32,uchar *blind32)

{
  uint uVar1;
  undefined1 local_1e0 [8];
  secp256k1_scalar blind;
  uchar local_1b8 [4];
  int ret;
  uchar b32 [32];
  secp256k1_sha256 sha256;
  undefined1 local_128 [4];
  int overflow;
  secp256k1_gej accum;
  secp256k1_ge add;
  secp256k1_fe t;
  uchar *blind32_local;
  uchar *key32_local;
  secp256k1_generator *gen_local;
  secp256k1_context *ctx_local;
  
  memset(&add.infinity,0,0x28);
  add.infinity = 4;
  add._84_4_ = 0;
  blind.d[3]._4_4_ = 1;
  if (blind32 != (uchar *)0x0) {
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_1e0,blind32,(int *)((long)&sha256.bytes + 4))
    ;
    blind.d[3]._4_4_ = (uint)((sha256.bytes._4_4_ != 0 ^ 0xffU) & 1);
    secp256k1_ecmult_gen
              (&ctx->ecmult_gen_ctx,(secp256k1_gej *)local_128,(secp256k1_scalar *)local_1e0);
  }
  secp256k1_sha256_initialize((secp256k1_sha256 *)(b32 + 0x18));
  secp256k1_sha256_write((secp256k1_sha256 *)(b32 + 0x18),"1st generation: ",0x10);
  secp256k1_sha256_write((secp256k1_sha256 *)(b32 + 0x18),key32,0x20);
  secp256k1_sha256_finalize((secp256k1_sha256 *)(b32 + 0x18),local_1b8);
  uVar1 = secp256k1_fe_set_b32((secp256k1_fe *)&add.infinity,local_1b8);
  blind.d[3]._4_4_ = uVar1 & blind.d[3]._4_4_;
  shallue_van_de_woestijne((secp256k1_ge *)&accum.infinity,(secp256k1_fe *)&add.infinity);
  if (blind32 == (uchar *)0x0) {
    secp256k1_gej_set_ge((secp256k1_gej *)local_128,(secp256k1_ge *)&accum.infinity);
  }
  else {
    secp256k1_gej_add_ge
              ((secp256k1_gej *)local_128,(secp256k1_gej *)local_128,(secp256k1_ge *)&accum.infinity
              );
  }
  secp256k1_sha256_initialize((secp256k1_sha256 *)(b32 + 0x18));
  secp256k1_sha256_write((secp256k1_sha256 *)(b32 + 0x18),"2nd generation: ",0x10);
  secp256k1_sha256_write((secp256k1_sha256 *)(b32 + 0x18),key32,0x20);
  secp256k1_sha256_finalize((secp256k1_sha256 *)(b32 + 0x18),local_1b8);
  uVar1 = secp256k1_fe_set_b32((secp256k1_fe *)&add.infinity,local_1b8);
  blind.d[3]._4_4_ = uVar1 & blind.d[3]._4_4_;
  shallue_van_de_woestijne((secp256k1_ge *)&accum.infinity,(secp256k1_fe *)&add.infinity);
  secp256k1_gej_add_ge
            ((secp256k1_gej *)local_128,(secp256k1_gej *)local_128,(secp256k1_ge *)&accum.infinity);
  secp256k1_ge_set_gej((secp256k1_ge *)&accum.infinity,(secp256k1_gej *)local_128);
  secp256k1_generator_save(gen,(secp256k1_ge *)&accum.infinity);
  return blind.d[3]._4_4_;
}

Assistant:

static int secp256k1_generator_generate_internal(const secp256k1_context* ctx, secp256k1_generator* gen, const unsigned char *key32, const unsigned char *blind32) {
    static const unsigned char prefix1[17] = "1st generation: ";
    static const unsigned char prefix2[17] = "2nd generation: ";
    secp256k1_fe t = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 4);
    secp256k1_ge add;
    secp256k1_gej accum;
    int overflow;
    secp256k1_sha256 sha256;
    unsigned char b32[32];
    int ret = 1;

    if (blind32) {
        secp256k1_scalar blind;
        secp256k1_scalar_set_b32(&blind, blind32, &overflow);
        ret = !overflow;
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &accum, &blind);
    }

    secp256k1_sha256_initialize(&sha256);
    secp256k1_sha256_write(&sha256, prefix1, 16);
    secp256k1_sha256_write(&sha256, key32, 32);
    secp256k1_sha256_finalize(&sha256, b32);
    ret &= secp256k1_fe_set_b32(&t, b32);
    shallue_van_de_woestijne(&add, &t);
    if (blind32) {
        secp256k1_gej_add_ge(&accum, &accum, &add);
    } else {
        secp256k1_gej_set_ge(&accum, &add);
    }

    secp256k1_sha256_initialize(&sha256);
    secp256k1_sha256_write(&sha256, prefix2, 16);
    secp256k1_sha256_write(&sha256, key32, 32);
    secp256k1_sha256_finalize(&sha256, b32);
    ret &= secp256k1_fe_set_b32(&t, b32);
    shallue_van_de_woestijne(&add, &t);
    secp256k1_gej_add_ge(&accum, &accum, &add);

    secp256k1_ge_set_gej(&add, &accum);
    secp256k1_generator_save(gen, &add);
    return ret;
}